

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O1

void Kit_TruthCountOnesInCofs0(uint *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  uVar2 = 1 << ((char)nVars - 5U & 0x1f);
  memset(pStore,0,(long)nVars * 4);
  if (nVars < 6) {
    if (0 < nVars) {
      uVar2 = (*pTruth >> 2 & 0x11111111) + (*pTruth & 0x11111111);
      uVar2 = (uVar2 >> 4 & 0x3030303) + (uVar2 & 0x3030303);
      uVar2 = (uVar2 >> 8 & 0x70007) + (uVar2 & 0x70007);
      *pStore = (uVar2 >> 0x10) + (uVar2 & 0xffff);
    }
    if (1 < nVars) {
      uVar2 = (*pTruth >> 1 & 0x11111111) + (*pTruth & 0x11111111);
      uVar2 = (uVar2 >> 4 & 0x3030303) + (uVar2 & 0x3030303);
      uVar2 = (uVar2 >> 8 & 0x70007) + (uVar2 & 0x70007);
      pStore[1] = (uVar2 >> 0x10) + (uVar2 & 0xffff);
    }
    if (2 < nVars) {
      uVar2 = (*pTruth >> 1 & 0x5050505) + (*pTruth & 0x5050505);
      uVar2 = (uVar2 >> 2 & 0x3030303) + (uVar2 & 0x3030303);
      uVar2 = (uVar2 >> 8 & 0x70007) + (uVar2 & 0x70007);
      pStore[2] = (uVar2 >> 0x10) + (uVar2 & 0xffff);
    }
    if (3 < nVars) {
      uVar2 = (*pTruth >> 1 & 0x550055) + (*pTruth & 0x550055);
      uVar2 = (uVar2 >> 2 & 0x330033) + (uVar2 & 0x330033);
      uVar2 = (uVar2 >> 4 & 0x70007) + (uVar2 & 0x70007);
      pStore[3] = (uVar2 >> 0x10) + (uVar2 & 0xffff);
    }
    if (nVars == 5) {
      uVar2 = (*pTruth >> 1 & 0x5555) + (*pTruth & 0x5555);
      uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
      uVar2 = (uVar2 >> 4 & 0x707) + (uVar2 & 0x707);
      pStore[4] = (uVar2 >> 8) + (uVar2 & 0xff);
    }
  }
  else {
    if (0 < (int)uVar2) {
      uVar1 = 0;
      do {
        uVar4 = (pTruth[uVar1] >> 1 & 0x55555555) + (pTruth[uVar1] & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        lVar7 = 0;
        do {
          if (((uint)uVar1 >> ((uint)lVar7 & 0x1f) & 1) == 0) {
            pStore[lVar7 + 5] = pStore[lVar7 + 5] + (uVar4 >> 0x10) + (uVar4 & 0xffff);
          }
          lVar7 = lVar7 + 1;
        } while ((ulong)(uint)nVars - 5 != lVar7);
        uVar1 = uVar1 + 1;
      } while (uVar1 != uVar2);
    }
    if (1 < (int)uVar2) {
      iVar8 = *pStore;
      iVar5 = pStore[1];
      iVar6 = pStore[2];
      iVar3 = pStore[3];
      iVar9 = pStore[4];
      lVar7 = 0;
      do {
        uVar4 = (pTruth[lVar7 * 2 + 1] & 0x55555555) + (pTruth[lVar7 * 2] & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar8 = (uVar4 >> 0x10) + iVar8 + (uVar4 & 0xff);
        *pStore = iVar8;
        uVar4 = (pTruth[lVar7 * 2] & 0x33333333) + (pTruth[lVar7 * 2 + 1] & 0xf3333333) * 4;
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar5 = (uVar4 >> 0x10) + iVar5 + (uVar4 & 0xff);
        pStore[1] = iVar5;
        uVar4 = (pTruth[lVar7 * 2 + 1] & 0xf0f0f0f) << 4 | pTruth[lVar7 * 2] & 0xf0f0f0f;
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar6 = (uVar4 >> 0x10) + iVar6 + (uVar4 & 0xff);
        pStore[2] = iVar6;
        uVar4 = (pTruth[lVar7 * 2 + 1] & 0xff00ff) << 8 | pTruth[lVar7 * 2] & 0xff00ff;
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar3 = (uVar4 >> 0x10) + iVar3 + (uVar4 & 0xff);
        pStore[3] = iVar3;
        uVar4 = pTruth[lVar7 * 2 + 1] << 0x10 | (uint)(ushort)pTruth[lVar7 * 2];
        uVar4 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
        uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
        uVar4 = (uVar4 >> 4 & 0x7070707) + (uVar4 & 0x7070707);
        uVar4 = (uVar4 >> 8 & 0xf000f) + (uVar4 & 0xf000f);
        iVar9 = (uVar4 >> 0x10) + iVar9 + (uVar4 & 0xff);
        pStore[4] = iVar9;
        lVar7 = lVar7 + 1;
      } while ((int)uVar2 / 2 != (int)lVar7);
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs0( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
            pStore[0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
        if ( nVars > 1 )
            pStore[1] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
        if ( nVars > 2 )
            pStore[2] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
        if ( nVars > 3 )
            pStore[3] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
        if ( nVars > 4 )
            pStore[4] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( (k & (1 << (i-5))) == 0 )
                pStore[i] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[1] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[3] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[4] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pTruth += 2;
    }
}